

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templates.h
# Opt level: O0

FActionMap *
BinarySearch<FActionMap,unsigned_int>
          (FActionMap *first,int max,offset_in_FActionMap_to_unknown keyptr,uint key)

{
  int iVar1;
  char *pcVar2;
  uint *seekey;
  FActionMap *probe;
  int local_30;
  int mid;
  int min;
  uint key_local;
  offset_in_FActionMap_to_unknown keyptr_local;
  int max_local;
  FActionMap *first_local;
  
  local_30 = 0;
  keyptr_local._4_4_ = max + -1;
  while( true ) {
    if (keyptr_local._4_4_ < local_30) {
      return (FActionMap *)0x0;
    }
    iVar1 = (local_30 + keyptr_local._4_4_) / 2;
    pcVar2 = first[iVar1].Name + (keyptr - 0xc);
    if (*(uint *)pcVar2 == key) break;
    if (*(uint *)pcVar2 < key) {
      local_30 = iVar1 + 1;
    }
    else {
      keyptr_local._4_4_ = iVar1 + -1;
    }
  }
  return first + iVar1;
}

Assistant:

inline
const ClassType *BinarySearch (const ClassType *first, int max,
	const KeyType ClassType::*keyptr, const KeyType key)
{
	int min = 0;
	--max;

	while (min <= max)
	{
		int mid = (min + max) / 2;
		const ClassType *probe = &first[mid];
		const KeyType &seekey = probe->*keyptr;
		if (seekey == key)
		{
			return probe;
		}
		else if (seekey < key)
		{
			min = mid + 1;
		}
		else
		{
			max = mid - 1;
		}
	}
	return NULL;
}